

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void fillMath(ElementType a,ElementType b,ElementType c,ElementType d,ElementType e,ElementType f,
             Storage3D *field,int64_t domain_size,int64_t domain_height)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined8 local_88;
  int64_t k;
  ElementType y;
  ElementType x;
  int64_t i;
  int64_t j;
  ElementType dy;
  ElementType dx;
  int64_t domain_height_local;
  int64_t domain_size_local;
  Storage3D *field_local;
  ElementType f_local;
  ElementType e_local;
  ElementType d_local;
  ElementType c_local;
  ElementType b_local;
  ElementType a_local;
  
  lVar2 = halo_width * 2;
  lVar3 = halo_width * 2;
  for (i = -halo_width; i < domain_size + halo_width; i = i + 1) {
    for (x = (ElementType)-halo_width; (long)x < domain_size + halo_width;
        x = (ElementType)((long)x + 1)) {
      dVar4 = (1.0 / (double)(domain_size + lVar2)) * (double)(long)x;
      dVar5 = (1.0 / (double)(domain_size + lVar3)) * (double)i;
      for (local_88 = 0; local_88 < domain_height; local_88 = local_88 + 1) {
        dVar6 = cos(pi * (c * dVar5 + dVar4));
        dVar7 = sin(d * pi * (e * dVar5 + dVar4));
        pdVar1 = (anonymous_namespace)::Storage<double,3ul>::operator()
                           ((Storage<double,3ul> *)field,(long)x,i,local_88);
        *pdVar1 = (double)local_88 * 0.01 + (a * (b + dVar6 + dVar7)) / f;
      }
    }
  }
  return;
}

Assistant:

void fillMath(ElementType a, ElementType b, ElementType c, ElementType d,
              ElementType e, ElementType f, Storage3D &field, const int64_t domain_size, const int64_t domain_height) {
  ElementType dx = ElementType(1.0) / (ElementType) (domain_size + 2*halo_width);
  ElementType dy = ElementType(1.0) / (ElementType) (domain_size + 2*halo_width);

  for (int64_t j = -halo_width; j < domain_size + halo_width; j++) {
    for (int64_t i = -halo_width; i < domain_size + halo_width; i++) {
      ElementType x = dx * (ElementType) i;
      ElementType y = dy * (ElementType) j;
      for (int64_t k = 0; k < domain_height; k++) {
          field(i, j, k) = k*ElementType(10e-3) + a*(b + cos(pi*(x + c*y)) + sin(d*pi*(x + e*y)))/f;
      }
    }
  }
}